

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Estimators.cc
# Opt level: O0

void __thiscall Estimate::LS::CalcEstimate(LS *this,VectorXd *y)

{
  MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
  *this_00;
  long in_RDI;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  PVar1;
  MatrixXd Rinv;
  MatrixXd H;
  DenseBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *in_stack_fffffffffffffeb8;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffec0;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffec8;
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *in_stack_fffffffffffffed0;
  
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffec0,
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffeb8);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffeb8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Inverse<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffec0,
             (EigenBase<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffffeb8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffeb8);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
            ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffffec0,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffeb8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
  ::operator*(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
  ::inverse((MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
             *)in_stack_fffffffffffffec0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffec0,
             (DenseBase<Eigen::Inverse<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
              *)in_stack_fffffffffffffeb8);
  this_00 = (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
             *)(in_RDI + 0x68);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffeb8);
  PVar1 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                    (in_stack_fffffffffffffec0,
                     (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                     in_stack_fffffffffffffeb8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,0>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)PVar1.m_lhs);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,0>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)PVar1.m_lhs);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)PVar1.m_rhs.m_matrix.m_matrix,
             in_stack_fffffffffffffeb8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x17180b);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x171818);
  return;
}

Assistant:

void LS::CalcEstimate(Eigen::VectorXd y){

		//extract locals
		Eigen::MatrixXd H = this->H_;

		//invert R
		Eigen::MatrixXd Rinv = this->R_.inverse();

		//covariance
		this->Phat_ = (H.transpose()*Rinv*H).inverse();

		//estimate
		this->xhat_ = this->Phat_*H.transpose()*Rinv*y;


	}